

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::to_function_name_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,TextureFunctionNameArguments *args)

{
  MSLFormatResolution MVar1;
  SPIRType *pSVar2;
  Variant *pVVar3;
  bool bVar4;
  SPIRVariable *pSVar5;
  MSLConstexprSampler *pMVar6;
  SPIRCombinedImageSampler *pSVar7;
  long *plVar8;
  runtime_error *prVar9;
  long *plVar10;
  char *pcVar11;
  uint32_t id;
  char *pcVar12;
  uint chain;
  ulong uVar13;
  bool bVar14;
  string *fname;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  chain = (args->base).img.id;
  uVar13 = (ulong)chain;
  pSVar2 = (args->base).imgtype;
  pSVar5 = Compiler::maybe_get_backing_variable((Compiler *)this,chain);
  if (pSVar5 == (SPIRVariable *)0x0) {
    bVar4 = false;
    pMVar6 = (MSLConstexprSampler *)0x0;
  }
  else {
    id = (pSVar5->basevariable).id;
    if (id == 0) {
      id = (pSVar5->super_IVariant).self.id;
    }
    pMVar6 = find_constexpr_sampler(this,id);
    bVar4 = Compiler::has_extended_decoration
                      ((Compiler *)this,(pSVar5->super_IVariant).self.id,
                       SPIRVCrossDecorationDynamicImageSampler);
  }
  if ((((this->msl_options).swizzle_texture_samples == true) &&
      ((args->base).is_gather == true && bVar4 == false)) &&
     ((pMVar6 == (MSLConstexprSampler *)0x0 || (pMVar6->ycbcr_conversion_enable == false)))) {
    add_spv_func_and_recompile(this,(pSVar2->image).depth + SPVFuncImplGatherSwizzle);
    bVar4 = (pSVar2->image).depth;
    pcVar12 = "spvGatherSwizzle";
    if (bVar4 != false) {
      pcVar12 = "spvGatherCompareSwizzle";
    }
    pcVar11 = pcVar12 + 0x10;
    if (bVar4 != false) {
      pcVar11 = pcVar12 + 0x17;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar12,pcVar11);
  }
  else {
    if (uVar13 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.buffer_size) {
      pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar3[uVar13].type == TypeCombinedImageSampler) {
        pSVar7 = Variant::get<spirv_cross::SPIRCombinedImageSampler>(pVVar3 + uVar13);
      }
      else {
        pSVar7 = (SPIRCombinedImageSampler *)0x0;
      }
    }
    else {
      pSVar7 = (SPIRCombinedImageSampler *)0x0;
    }
    local_58 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    bVar14 = true;
    if ((pMVar6 != (MSLConstexprSampler *)0x0) && (pMVar6->ycbcr_conversion_enable == true)) {
      bVar14 = pMVar6->planes < 2;
    }
    if (bVar4 == false && !bVar14) {
      if ((pMVar6->planes & 0xfffffffe) != 2) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_78 = &local_68;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"Unhandled number of color image planes!","");
        ::std::runtime_error::runtime_error(prVar9,(string *)&local_78);
        *(undefined ***)prVar9 = &PTR__runtime_error_0035b0b8;
        __cxa_throw(prVar9,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((pMVar6->resolution == MSL_FORMAT_RESOLUTION_444) ||
         (pMVar6->chroma_filter == MSL_SAMPLER_FILTER_NEAREST)) {
        add_spv_func_and_recompile
                  (this,pMVar6->planes == 2 ^ SPVFuncImplChromaReconstructNearest3Plane);
        ::std::__cxx11::string::_M_replace
                  ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
                   0x2f4ec1);
        return __return_storage_ptr__;
      }
      ::std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x2f4edd);
      MVar1 = pMVar6->resolution;
      if (MVar1 == MSL_FORMAT_RESOLUTION_422) {
        if (pMVar6->x_chroma_offset == MSL_CHROMA_LOCATION_MIDPOINT) {
          add_spv_func_and_recompile
                    (this,pMVar6->planes == 2 ^ SPVFuncImplChromaReconstructLinear422Midpoint3Plane)
          ;
        }
        else {
          if (pMVar6->x_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_78 = &local_68;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,"Invalid chroma location.","");
            ::std::runtime_error::runtime_error(prVar9,(string *)&local_78);
            *(undefined ***)prVar9 = &PTR__runtime_error_0035b0b8;
            __cxa_throw(prVar9,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          add_spv_func_and_recompile
                    (this,pMVar6->planes == 2 ^
                          SPVFuncImplChromaReconstructLinear422CositedEven3Plane);
        }
      }
      else {
        if (MVar1 != MSL_FORMAT_RESOLUTION_420) {
          if (MVar1 != MSL_FORMAT_RESOLUTION_444) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_78 = &local_68;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,"Invalid format resolution.","");
            ::std::runtime_error::runtime_error(prVar9,(string *)&local_78);
            *(undefined ***)prVar9 = &PTR__runtime_error_0035b0b8;
            __cxa_throw(prVar9,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x1f0b,
                        "virtual string spirv_cross::CompilerMSL::to_function_name(const TextureFunctionNameArguments &)"
                       );
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        if (pMVar6->x_chroma_offset == MSL_CHROMA_LOCATION_MIDPOINT) {
          if (pMVar6->y_chroma_offset == MSL_CHROMA_LOCATION_MIDPOINT) {
            add_spv_func_and_recompile
                      (this,pMVar6->planes == 2 ^
                            SPVFuncImplChromaReconstructLinear420XMidpointYMidpoint3Plane);
          }
          else {
            if (pMVar6->y_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
              prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_78 = &local_68;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_78,"Invalid Y chroma location.","");
              ::std::runtime_error::runtime_error(prVar9,(string *)&local_78);
              *(undefined ***)prVar9 = &PTR__runtime_error_0035b0b8;
              __cxa_throw(prVar9,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            add_spv_func_and_recompile
                      (this,pMVar6->planes == 2 ^
                            SPVFuncImplChromaReconstructLinear420XMidpointYCositedEven3Plane);
          }
        }
        else {
          if (pMVar6->x_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_78 = &local_68;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,"Invalid X chroma location.","");
            ::std::runtime_error::runtime_error(prVar9,(string *)&local_78);
            *(undefined ***)prVar9 = &PTR__runtime_error_0035b0b8;
            __cxa_throw(prVar9,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (pMVar6->y_chroma_offset == MSL_CHROMA_LOCATION_MIDPOINT) {
            add_spv_func_and_recompile
                      (this,pMVar6->planes == 2 ^
                            SPVFuncImplChromaReconstructLinear420XCositedEvenYMidpoint3Plane);
          }
          else {
            if (pMVar6->y_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
              prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_78 = &local_68;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_78,"Invalid Y chroma location.","");
              ::std::runtime_error::runtime_error(prVar9,(string *)&local_78);
              *(undefined ***)prVar9 = &PTR__runtime_error_0035b0b8;
              __cxa_throw(prVar9,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            add_spv_func_and_recompile
                      (this,pMVar6->planes == 2 ^
                            SPVFuncImplChromaReconstructLinear420XCositedEvenYCositedEven3Plane);
          }
        }
      }
    }
    else {
      if (pSVar7 != (SPIRCombinedImageSampler *)0x0) {
        chain = (pSVar7->image).id;
      }
      CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,chain,true);
      plVar8 = (long *)::std::__cxx11::string::append((char *)&local_50);
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_68 = *plVar10;
        lStack_60 = plVar8[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar10;
        local_78 = (long *)*plVar8;
      }
      local_70 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
      if (local_78 != &local_68) {
        operator_delete(local_78);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (args->has_dref != true) {
        return __return_storage_ptr__;
      }
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_function_name(const TextureFunctionNameArguments &args)
{
	VariableID img = args.base.img;
	auto &imgtype = *args.base.imgtype;

	const MSLConstexprSampler *constexpr_sampler = nullptr;
	bool is_dynamic_img_sampler = false;
	if (auto *var = maybe_get_backing_variable(img))
	{
		constexpr_sampler = find_constexpr_sampler(var->basevariable ? var->basevariable : VariableID(var->self));
		is_dynamic_img_sampler = has_extended_decoration(var->self, SPIRVCrossDecorationDynamicImageSampler);
	}

	// Special-case gather. We have to alter the component being looked up
	// in the swizzle case.
	if (msl_options.swizzle_texture_samples && args.base.is_gather && !is_dynamic_img_sampler &&
	    (!constexpr_sampler || !constexpr_sampler->ycbcr_conversion_enable))
	{
		add_spv_func_and_recompile(imgtype.image.depth ? SPVFuncImplGatherCompareSwizzle : SPVFuncImplGatherSwizzle);
		return imgtype.image.depth ? "spvGatherCompareSwizzle" : "spvGatherSwizzle";
	}

	auto *combined = maybe_get<SPIRCombinedImageSampler>(img);

	// Texture reference
	string fname;
	if (needs_chroma_reconstruction(constexpr_sampler) && !is_dynamic_img_sampler)
	{
		if (constexpr_sampler->planes != 2 && constexpr_sampler->planes != 3)
			SPIRV_CROSS_THROW("Unhandled number of color image planes!");
		// 444 images aren't downsampled, so we don't need to do linear filtering.
		if (constexpr_sampler->resolution == MSL_FORMAT_RESOLUTION_444 ||
		    constexpr_sampler->chroma_filter == MSL_SAMPLER_FILTER_NEAREST)
		{
			if (constexpr_sampler->planes == 2)
				add_spv_func_and_recompile(SPVFuncImplChromaReconstructNearest2Plane);
			else
				add_spv_func_and_recompile(SPVFuncImplChromaReconstructNearest3Plane);
			fname = "spvChromaReconstructNearest";
		}
		else // Linear with a downsampled format
		{
			fname = "spvChromaReconstructLinear";
			switch (constexpr_sampler->resolution)
			{
			case MSL_FORMAT_RESOLUTION_444:
				assert(false);
				break; // not reached
			case MSL_FORMAT_RESOLUTION_422:
				switch (constexpr_sampler->x_chroma_offset)
				{
				case MSL_CHROMA_LOCATION_COSITED_EVEN:
					if (constexpr_sampler->planes == 2)
						add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear422CositedEven2Plane);
					else
						add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear422CositedEven3Plane);
					fname += "422CositedEven";
					break;
				case MSL_CHROMA_LOCATION_MIDPOINT:
					if (constexpr_sampler->planes == 2)
						add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear422Midpoint2Plane);
					else
						add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear422Midpoint3Plane);
					fname += "422Midpoint";
					break;
				default:
					SPIRV_CROSS_THROW("Invalid chroma location.");
				}
				break;
			case MSL_FORMAT_RESOLUTION_420:
				fname += "420";
				switch (constexpr_sampler->x_chroma_offset)
				{
				case MSL_CHROMA_LOCATION_COSITED_EVEN:
					switch (constexpr_sampler->y_chroma_offset)
					{
					case MSL_CHROMA_LOCATION_COSITED_EVEN:
						if (constexpr_sampler->planes == 2)
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XCositedEvenYCositedEven2Plane);
						else
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XCositedEvenYCositedEven3Plane);
						fname += "XCositedEvenYCositedEven";
						break;
					case MSL_CHROMA_LOCATION_MIDPOINT:
						if (constexpr_sampler->planes == 2)
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XCositedEvenYMidpoint2Plane);
						else
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XCositedEvenYMidpoint3Plane);
						fname += "XCositedEvenYMidpoint";
						break;
					default:
						SPIRV_CROSS_THROW("Invalid Y chroma location.");
					}
					break;
				case MSL_CHROMA_LOCATION_MIDPOINT:
					switch (constexpr_sampler->y_chroma_offset)
					{
					case MSL_CHROMA_LOCATION_COSITED_EVEN:
						if (constexpr_sampler->planes == 2)
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XMidpointYCositedEven2Plane);
						else
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XMidpointYCositedEven3Plane);
						fname += "XMidpointYCositedEven";
						break;
					case MSL_CHROMA_LOCATION_MIDPOINT:
						if (constexpr_sampler->planes == 2)
							add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear420XMidpointYMidpoint2Plane);
						else
							add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear420XMidpointYMidpoint3Plane);
						fname += "XMidpointYMidpoint";
						break;
					default:
						SPIRV_CROSS_THROW("Invalid Y chroma location.");
					}
					break;
				default:
					SPIRV_CROSS_THROW("Invalid X chroma location.");
				}
				break;
			default:
				SPIRV_CROSS_THROW("Invalid format resolution.");
			}
		}
	}
	else
	{
		fname = to_expression(combined ? combined->image : img) + ".";

		// Texture function and sampler
		if (args.base.is_fetch)
			fname += "read";
		else if (args.base.is_gather)
			fname += "gather";
		else
			fname += "sample";

		if (args.has_dref)
			fname += "_compare";
	}

	return fname;
}